

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O1

uint Assimp::IFC::ProcessMaterials
               (uint64_t id,uint prevMatId,ConversionData *conv,bool forceDefaultMat)

{
  pointer *pppaVar1;
  DataType *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Base_ptr p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar4;
  pointer ppaVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  IfcSurfaceStyle *pIVar8;
  size_type sVar9;
  int iVar10;
  LazyObject *this_01;
  Object *pOVar11;
  long lVar12;
  IfcPresentationStyleAssignment *pIVar13;
  IfcSurfaceStyle *pIVar14;
  _Base_ptr p_Var15;
  IfcSurfaceStyleShading *pIVar16;
  IfcColourRgb *in;
  long *plVar17;
  mapped_type *pmVar18;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var19;
  aiMaterial *paVar20;
  undefined7 in_register_00000009;
  undefined8 *puVar21;
  _Rb_tree_header *p_Var22;
  size_type *psVar23;
  pointer psVar24;
  _Rb_tree_header *p_Var25;
  ulong uVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer ppaVar27;
  undefined4 uVar28;
  uint uVar29;
  ulong unaff_R15;
  bool bVar30;
  bool bVar31;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar32;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat_1;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  aiColor4D col_1;
  int shading;
  IfcSurfaceStyle *surf;
  string side;
  aiColor4D col_base;
  aiColor4D col;
  aiString name;
  int local_948;
  int local_944;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  aiColor4D local_918;
  undefined4 local_8fc;
  uint local_8f8;
  undefined4 local_8f4;
  IfcSurfaceStyle *local_8f0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_8e8;
  _Base_ptr local_8e0;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  _Rb_tree_header *local_8c0;
  MaterialCache *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  pointer local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  aiColor4D local_858;
  uint64_t local_848;
  undefined1 local_840 [8];
  size_type sStack_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830 [6];
  ios_base local_7d0 [920];
  aiString local_438;
  
  local_8fc = (undefined4)CONCAT71(in_register_00000009,forceDefaultMat);
  local_8f8 = prevMatId;
  local_848 = id;
  pVar32 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(&(conv->db->refs)._M_t,&local_848);
  local_8e8 = pVar32.second._M_node;
  if (pVar32.first._M_node._M_node != local_8e8._M_node) {
    local_8b8 = &conv->cached_materials;
    p_Var25 = &(conv->cached_materials)._M_t._M_impl.super__Rb_tree_header;
    local_8d8 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials;
    local_8c0 = p_Var25;
    do {
      local_8e8 = pVar32.second._M_node;
      local_8e0 = (_Base_ptr)pVar32.first._M_node;
      this_01 = STEP::DB::GetObject(conv->db,(uint64_t)local_8e0[1]._M_parent);
      pOVar11 = STEP::LazyObject::operator*(this_01);
      lVar12 = __dynamic_cast(pOVar11,&STEP::Object::typeinfo,&Schema_2x3::IfcStyledItem::typeinfo,
                              0xffffffffffffffff);
      if (lVar12 == 0) {
        bVar30 = true;
      }
      else {
        puVar21 = *(undefined8 **)(lVar12 + 0x30);
        local_8d0 = *(undefined8 **)(lVar12 + 0x38);
        local_948 = 5;
        if (puVar21 != local_8d0) {
          do {
            local_8c8 = puVar21;
            pIVar13 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>
                                ((LazyObject *)*puVar21);
            puVar21 = *(undefined8 **)
                       &(pIVar13->
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                        ).field_0x10;
            local_8b0 = *(undefined8 **)
                         &(pIVar13->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                          ).field_0x18;
            local_944 = 0;
            bVar30 = puVar21 == local_8b0;
            while (!bVar30) {
              pDVar2 = (DataType *)*puVar21;
              this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar21[1];
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this->_M_use_count = this->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this->_M_use_count = this->_M_use_count + 1;
                }
              }
              local_8a8 = puVar21;
              pIVar14 = STEP::EXPRESS::DataType::
                        ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>(pDVar2,conv->db);
              local_8f0 = pIVar14;
              if (pIVar14 != (IfcSurfaceStyle *)0x0) {
                p_Var3 = (conv->cached_materials)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_parent;
                p_Var15 = &p_Var25->_M_header;
                for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
                    p_Var3 = (&p_Var3->_M_left)[*(IfcSurfaceStyle **)(p_Var3 + 1) < pIVar14]) {
                  if (*(IfcSurfaceStyle **)(p_Var3 + 1) >= pIVar14) {
                    p_Var15 = p_Var3;
                  }
                }
                p_Var22 = p_Var25;
                if (((_Rb_tree_header *)p_Var15 != p_Var25) &&
                   (p_Var22 = (_Rb_tree_header *)p_Var15,
                   pIVar14 < (IfcSurfaceStyle *)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
                  p_Var22 = p_Var25;
                }
                if (p_Var22 == p_Var25) {
                  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
                  lVar12 = *(long *)&(pIVar14->super_IfcPresentationStyle).field_0x48;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_898,lVar12,*(long *)&pIVar14->field_0x50 + lVar12);
                  iVar10 = std::__cxx11::string::compare((char *)&local_898);
                  if (iVar10 != 0) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_840,
                                   "ignoring surface side marker on IFC::IfcSurfaceStyle: ",
                                   &local_898);
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    basic_formatter<std::__cxx11::string>
                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_438,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_840);
                    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&local_438);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                    std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
                    if (local_840 != (undefined1  [8])local_830) {
                      operator_delete((void *)local_840);
                    }
                  }
                  paVar20 = (aiMaterial *)operator_new(0x10);
                  aiMaterial::aiMaterial(paVar20);
                  pIVar8 = local_8f0;
                  local_438.length = 0;
                  local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
                  memset(local_438.data + 1,0x1b,0x3ff);
                  local_840 = (undefined1  [8])local_830;
                  if ((pIVar8->super_IfcPresentationStyle).field_0x30 == '\x01') {
                    lVar12 = *(long *)&(pIVar8->super_IfcPresentationStyle).
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                       .field_0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_840,lVar12,
                               *(long *)&(pIVar8->super_IfcPresentationStyle).
                                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                         .field_0x18 + lVar12);
                  }
                  else {
                    local_938._M_dataplus._M_p = (pointer)0x17;
                    local_840 = (undefined1  [8])
                                std::__cxx11::string::_M_create
                                          ((ulong *)local_840,(ulong)&local_938);
                    local_830[0]._M_allocated_capacity = local_938._M_dataplus._M_p;
                    *(undefined8 *)local_840 = 0x6166727553636649;
                    *(char *)((long)local_840 + 8) = 'c';
                    *(char *)((long)local_840 + 9) = 'e';
                    *(char *)((long)local_840 + 10) = 'S';
                    *(char *)((long)local_840 + 0xb) = 't';
                    *(char *)((long)local_840 + 0xc) = 'y';
                    *(char *)((long)local_840 + 0xd) = 'l';
                    *(char *)((long)local_840 + 0xe) = 'e';
                    *(char *)((long)local_840 + 0xf) = '_';
                    *(char *)((long)local_840 + 0xf) = '_';
                    *(char *)((long)local_840 + 0x10) = 'U';
                    *(char *)((long)local_840 + 0x11) = 'n';
                    *(char *)((long)local_840 + 0x12) = 'n';
                    *(char *)((long)local_840 + 0x13) = 'a';
                    *(char *)((long)local_840 + 0x14) = 'm';
                    *(char *)((long)local_840 + 0x15) = 'e';
                    *(char *)((long)local_840 + 0x16) = 'd';
                    sStack_838 = (size_type)local_938._M_dataplus._M_p;
                    *(char *)((long)local_840 + (long)local_938._M_dataplus._M_p) = '\0';
                  }
                  sVar9 = sStack_838;
                  if (sStack_838 <
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x400) {
                    local_438.length = (ai_uint32)sStack_838;
                    memcpy(local_438.data,(void *)local_840,sStack_838);
                    local_438.data[sVar9] = '\0';
                  }
                  if (local_840 != (undefined1  [8])local_830) {
                    operator_delete((void *)local_840);
                  }
                  aiMaterial::AddProperty(paVar20,&local_438,"?mat.name",0,0);
                  psVar24 = (pIVar8->Styles).
                            super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            .
                            super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_8a0 = (pIVar8->Styles).
                              super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              .
                              super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  if (psVar24 != local_8a0) {
                    do {
                      pDVar2 = (psVar24->
                               super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr;
                      this_00 = (psVar24->
                                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                )._M_refcount._M_pi;
                      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          this_00->_M_use_count = this_00->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          this_00->_M_use_count = this_00->_M_use_count + 1;
                        }
                      }
                      pIVar16 = STEP::EXPRESS::DataType::
                                ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                                          (pDVar2,conv->db);
                      if (pIVar16 != (IfcSurfaceStyleShading *)0x0) {
                        local_858.r = 0.0;
                        local_858.g = 0.0;
                        local_858.b = 0.0;
                        local_858.a = 0.0;
                        local_918.r = 0.0;
                        local_918.g = 0.0;
                        local_918.b = 0.0;
                        local_918.a = 0.0;
                        in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcColourRgb>
                                       (*(LazyObject **)
                                         &(pIVar16->
                                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                          ).field_0x10);
                        ConvertColor(&local_858,in);
                        aiMaterial::AddBinaryProperty
                                  (paVar20,&local_858,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                        lVar12 = __dynamic_cast((_func_int *)
                                                ((long)&(pIVar16->
                                                                                                                
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper +
                                                (long)(pIVar16->
                                                                                                            
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                                                &Schema_2x3::IfcSurfaceStyleRendering::typeinfo,
                                                0xffffffffffffffff);
                        if (lVar12 != 0) {
                          if (*(char *)(lVar12 + 0x30) == '\x01') {
                            local_840._0_4_ = 1.0 - (float)*(double *)(lVar12 + 0x28);
                            aiMaterial::AddBinaryProperty
                                      (paVar20,local_840,4,"$mat.opacity",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar12 + 0x48) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar12 + 0x38),conv,
                                         &local_858);
                            aiMaterial::AddBinaryProperty
                                      (paVar20,&local_918,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar12 + 0xa8) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar12 + 0x98),conv,
                                         &local_858);
                            aiMaterial::AddBinaryProperty
                                      (paVar20,&local_918,0x10,"$clr.specular",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar12 + 0x60) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar12 + 0x50),conv,
                                         &local_858);
                            aiMaterial::AddBinaryProperty
                                      (paVar20,&local_918,0x10,"$clr.transparent",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar12 + 0x90) == '\x01') {
                            ConvertColor(&local_918,*(IfcColourOrFactor **)(lVar12 + 0x80),conv,
                                         &local_858);
                            aiMaterial::AddBinaryProperty
                                      (paVar20,&local_918,0x10,"$clr.reflective",0,0,aiPTI_Float);
                          }
                          uVar28 = 2;
                          if ((*(char *)(lVar12 + 0xc0) == '\x01') &&
                             (*(char *)(lVar12 + 0xa8) == '\x01')) {
                            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar12 + 200);
                            iVar10 = std::__cxx11::string::compare((char *)__rhs);
                            if (iVar10 == 0) {
                              uVar28 = 4;
                            }
                            else {
                              iVar10 = std::__cxx11::string::compare((char *)__rhs);
                              uVar28 = 9;
                              if ((iVar10 != 0) &&
                                 (iVar10 = std::__cxx11::string::compare((char *)__rhs), iVar10 != 0
                                 )) {
                                iVar10 = std::__cxx11::string::compare((char *)__rhs);
                                uVar28 = 3;
                                if (iVar10 != 0) {
                                  std::operator+(&local_878,"shading mode ",__rhs);
                                  plVar17 = (long *)std::__cxx11::string::append((char *)&local_878)
                                  ;
                                  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
                                  psVar23 = (size_type *)(plVar17 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar17 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar23) {
                                    local_938.field_2._M_allocated_capacity = *psVar23;
                                    local_938.field_2._8_8_ = plVar17[3];
                                  }
                                  else {
                                    local_938.field_2._M_allocated_capacity = *psVar23;
                                    local_938._M_dataplus._M_p = (pointer)*plVar17;
                                  }
                                  local_938._M_string_length = plVar17[1];
                                  *plVar17 = (long)psVar23;
                                  plVar17[1] = 0;
                                  *(undefined1 *)(plVar17 + 2) = 0;
                                  Formatter::
                                  basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  ::basic_formatter<std::__cxx11::string>
                                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                              *)local_840,&local_938);
                                  LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_840);
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_840);
                                  std::ios_base::~ios_base(local_7d0);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_938._M_dataplus._M_p != &local_938.field_2) {
                                    operator_delete(local_938._M_dataplus._M_p);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_878._M_dataplus._M_p != &local_878.field_2) {
                                    operator_delete(local_878._M_dataplus._M_p);
                                  }
                                }
                              }
                            }
                          }
                          local_8f4 = uVar28;
                          aiMaterial::AddBinaryProperty
                                    (paVar20,&local_8f4,4,"$mat.shadingm",0,0,aiPTI_Integer);
                          if (*(char *)(lVar12 + 0xc0) == '\x01') {
                            lVar12 = __dynamic_cast(*(undefined8 *)(lVar12 + 0xb0),
                                                    &STEP::EXPRESS::DataType::typeinfo,
                                                    &STEP::EXPRESS::PrimitiveDataType<double>::
                                                     typeinfo,0);
                            if (lVar12 == 0) {
                              LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5d17fd);
                            }
                            else {
                              local_840._0_4_ = (float)*(double *)(lVar12 + 8);
                              aiMaterial::AddBinaryProperty
                                        (paVar20,local_840,4,"$mat.shininess",0,0,aiPTI_Float);
                            }
                          }
                        }
                      }
                      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                      }
                      psVar24 = psVar24 + 1;
                    } while (psVar24 != local_8a0);
                  }
                  local_438.length = (ai_uint32)paVar20;
                  local_438.data._0_4_ = SUB84((ulong)paVar20 >> 0x20,0);
                  iVar4._M_current =
                       (conv->materials).
                       super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (conv->materials).
                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
                    _M_realloc_insert<aiMaterial*>(local_8d8,iVar4,(aiMaterial **)&local_438);
                  }
                  else {
                    *iVar4._M_current = paVar20;
                    pppaVar1 = &(conv->materials).
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                    *pppaVar1 = *pppaVar1 + 1;
                  }
                  ppaVar27 = (conv->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start;
                  ppaVar5 = (conv->materials).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pmVar18 = std::
                            map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                            ::operator[](local_8b8,&local_8f0);
                  p_Var25 = local_8c0;
                  uVar29 = (int)((ulong)((long)ppaVar5 - (long)ppaVar27) >> 3) - 1;
                  unaff_R15 = (ulong)uVar29;
                  *pmVar18 = uVar29;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_898._M_dataplus._M_p != &local_898.field_2) {
                    operator_delete(local_898._M_dataplus._M_p);
                  }
                }
                else {
                  unaff_R15 = (ulong)*(uint *)(p_Var22 + 1);
                }
              }
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if (pIVar14 != (IfcSurfaceStyle *)0x0) {
                local_944 = 1;
                break;
              }
              puVar21 = local_8a8 + 2;
              bVar30 = puVar21 == local_8b0;
            }
            if (!bVar30) {
              local_948 = local_944;
              break;
            }
            puVar21 = local_8c8 + 1;
          } while (puVar21 != local_8d0);
        }
        bVar30 = local_948 == 0 || local_948 == 5;
      }
      if (!bVar30) {
        return (uint)unaff_R15;
      }
      _Var19._M_node = (_Base_ptr)std::_Rb_tree_increment(local_8e0);
      pVar32.second._M_node = local_8e8._M_node;
      pVar32.first._M_node = _Var19._M_node;
    } while (_Var19._M_node != local_8e8._M_node);
  }
  uVar29 = local_8f8;
  if ((char)local_8fc == '\x01' && local_8f8 == 0xffffffff) {
    local_438.length = 0;
    local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
    memset(local_438.data + 1,0x1b,0x3ff);
    local_438.length = 0xc;
    builtin_strncpy(local_438.data,"<IFCDefault>",0xd);
    ppaVar27 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    bVar30 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish != ppaVar27;
    uVar29 = (uint)unaff_R15;
    if (bVar30) {
      uVar26 = 0;
      do {
        local_840 = (undefined1  [8])((ulong)local_840 & 0xffffff0000000000);
        memset(local_840 + 5,0x1b,0x3ff);
        bVar31 = false;
        aiGetMaterialString(ppaVar27[uVar26],"?mat.name",0,0,(aiString *)local_840);
        if (local_438.length == local_840._0_4_) {
          iVar10 = bcmp(local_438.data,local_840 + 4,(ulong)local_438.length);
          bVar31 = iVar10 == 0;
        }
        uVar6 = unaff_R15;
        if (bVar31) {
          uVar6 = uVar26;
        }
        unaff_R15 = uVar6 & 0xffffffff;
        uVar29 = (uint)uVar6;
        if (bVar31) break;
        uVar26 = uVar26 + 1;
        ppaVar27 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar30 = uVar26 < (ulong)((long)(conv->materials).
                                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar27
                                 >> 3);
      } while (bVar30);
    }
    if (!bVar30) {
      paVar20 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar20);
      local_938._M_dataplus._M_p = (pointer)paVar20;
      aiMaterial::AddProperty(paVar20,&local_438,"?mat.name",0,0);
      local_840 = (undefined1  [8])0x3f19999a3f19999a;
      sStack_838 = 0x3f8000003f19999a;
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_938._M_dataplus._M_p,local_840,0x10,"$clr.diffuse",0,0,
                 aiPTI_Float);
      local_878._M_dataplus._M_p = local_938._M_dataplus._M_p;
      local_938._M_dataplus._M_p = (pointer)0x0;
      iVar4._M_current =
           (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*>
                  ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials,iVar4,
                   (aiMaterial **)&local_878);
      }
      else {
        *iVar4._M_current = (aiMaterial *)local_878._M_dataplus._M_p;
        pppaVar1 = &(conv->materials).
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      _Var7._M_p = local_938._M_dataplus._M_p;
      ppaVar27 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppaVar5 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((aiMaterial *)local_938._M_dataplus._M_p != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial((aiMaterial *)local_938._M_dataplus._M_p);
        operator_delete(_Var7._M_p);
      }
      uVar29 = (int)((ulong)((long)ppaVar27 - (long)ppaVar5) >> 3) - 1;
    }
  }
  return uVar29;
}

Assistant:

unsigned int ProcessMaterials(uint64_t id, unsigned int prevMatId, ConversionData& conv, bool forceDefaultMat) {
    STEP::DB::RefMapRange range = conv.db.GetRefs().equal_range(id);
    for(;range.first != range.second; ++range.first) {
        if(const IFC::Schema_2x3::IfcStyledItem* const styled = conv.db.GetObject((*range.first).second)->ToPtr<IFC::Schema_2x3::IfcStyledItem>()) {
            for(const IFC::Schema_2x3::IfcPresentationStyleAssignment& as : styled->Styles) {
                for(std::shared_ptr<const IFC::Schema_2x3::IfcPresentationStyleSelect> sel : as.Styles) {

                    if( const IFC::Schema_2x3::IfcSurfaceStyle* const surf = sel->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyle>(conv.db) ) {
                        // try to satisfy from cache
                        ConversionData::MaterialCache::iterator mit = conv.cached_materials.find(surf);
                        if( mit != conv.cached_materials.end() )
                            return mit->second;

                        // not found, create new material
                        const std::string side = static_cast<std::string>(surf->Side);
                        if( side != "BOTH" ) {
                            IFCImporter::LogWarn("ignoring surface side marker on IFC::IfcSurfaceStyle: " + side);
                        }

                        std::unique_ptr<aiMaterial> mat(new aiMaterial());

                        FillMaterial(mat.get(), surf, conv);

                        conv.materials.push_back(mat.release());
                        unsigned int matindex = static_cast<unsigned int>(conv.materials.size() - 1);
                        conv.cached_materials[surf] = matindex;
                        return matindex;
                    }
                }
            }
        }
    }

    // no local material defined. If there's global one, use that instead
    if ( prevMatId != std::numeric_limits<uint32_t>::max() ) {
        return prevMatId;
    }

    // we're still here - create an default material if required, or simply fail otherwise
    if ( !forceDefaultMat ) {
        return std::numeric_limits<uint32_t>::max();
    }

    aiString name;
    name.Set("<IFCDefault>");
    //  ConvertColorToString( color, name);

    // look if there's already a default material with this base color
    for( size_t a = 0; a < conv.materials.size(); ++a ) {
        aiString mname;
        conv.materials[a]->Get(AI_MATKEY_NAME, mname);
        if ( name == mname ) {
            return ( unsigned int )a;
        }
    }

    // we're here, yet - no default material with suitable color available. Generate one
    std::unique_ptr<aiMaterial> mat(new aiMaterial());
    mat->AddProperty(&name,AI_MATKEY_NAME);

    const aiColor4D col = aiColor4D( 0.6f, 0.6f, 0.6f, 1.0f); // aiColor4D( color.r, color.g, color.b, 1.0f);
    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);

    conv.materials.push_back(mat.release());
    return (unsigned int) conv.materials.size() - 1;
}